

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O2

void __thiscall cfd::api::json::DecodePsbtRequest::DecodePsbtRequest(DecodePsbtRequest *this)

{
  _Rb_tree_header *p_Var1;
  allocator local_22;
  allocator local_21;
  
  (this->super_JsonClassBase<cfd::api::json::DecodePsbtRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodePsbtRequest_00655670;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&this->psbt_,"",&local_21);
  std::__cxx11::string::string((string *)&this->network_,"mainnet",&local_22);
  this->has_detail_ = false;
  this->has_simple_ = false;
  CollectFieldName();
  return;
}

Assistant:

DecodePsbtRequest() {
    CollectFieldName();
  }